

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

bool __thiscall QAccessibleTable::selectRow(QAccessibleTable *this,int row)

{
  bool bVar1;
  SelectionBehavior SVar2;
  SelectionMode SVar3;
  int iVar4;
  QFlags<QItemSelectionModel::SelectionFlag> QVar5;
  QAbstractItemModel *pQVar6;
  QItemSelectionModel *pQVar7;
  ulong uVar8;
  int in_ESI;
  QAbstractItemView *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemModel *theModel;
  QAbstractItemView *theView;
  QModelIndex index;
  QModelIndex rootIndex;
  QModelIndex *in_stack_ffffffffffffff80;
  bool local_39;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  view((QAccessibleTable *)0x7f3f44);
  pQVar6 = QAbstractItemView::model(in_RDI);
  if (pQVar6 != (QAbstractItemModel *)0x0) {
    view((QAccessibleTable *)0x7f3f6a);
    pQVar7 = QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_ffffffffffffff80);
    if (pQVar7 != (QItemSelectionModel *)0x0) {
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QAbstractItemView::rootIndex((QAbstractItemView *)in_stack_ffffffffffffff80);
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      (**(code **)(*(long *)pQVar6 + 0x60))(&local_38,pQVar6,in_ESI,0,&local_20);
      bVar1 = QModelIndex::isValid(in_stack_ffffffffffffff80);
      if (bVar1) {
        view((QAccessibleTable *)0x7f400e);
        SVar2 = QAbstractItemView::selectionBehavior((QAbstractItemView *)in_stack_ffffffffffffff80)
        ;
        if (SVar2 != SelectColumns) {
          view((QAccessibleTable *)0x7f402f);
          SVar3 = QAbstractItemView::selectionMode((QAbstractItemView *)in_stack_ffffffffffffff80);
          if (SVar3 == NoSelection) {
            local_39 = false;
            goto LAB_007f4147;
          }
          if (SVar3 == SingleSelection) {
            view((QAccessibleTable *)0x7f4070);
            SVar2 = QAbstractItemView::selectionBehavior
                              ((QAbstractItemView *)in_stack_ffffffffffffff80);
            if ((SVar2 != SelectRows) &&
               (iVar4 = (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollArea).super_QFrame.
                                               super_QWidget + 0x58))(), 1 < iVar4)) {
              local_39 = false;
              goto LAB_007f4147;
            }
            view((QAccessibleTable *)0x7f40a1);
            QAbstractItemView::clearSelection((QAbstractItemView *)in_stack_ffffffffffffff80);
          }
          else if (SVar3 == ContiguousSelection) {
            if (in_ESI != 0) {
              pQVar7 = QAbstractItemView::selectionModel
                                 ((QAbstractItemView *)in_stack_ffffffffffffff80);
              uVar8 = QItemSelectionModel::isRowSelected
                                ((int)pQVar7,(QModelIndex *)(ulong)(in_ESI - 1));
              if ((uVar8 & 1) != 0) goto LAB_007f4104;
            }
            pQVar7 = QAbstractItemView::selectionModel
                               ((QAbstractItemView *)in_stack_ffffffffffffff80);
            uVar8 = QItemSelectionModel::isRowSelected
                              ((int)pQVar7,(QModelIndex *)(ulong)(in_ESI + 1));
            if ((uVar8 & 1) == 0) {
              QAbstractItemView::clearSelection((QAbstractItemView *)in_stack_ffffffffffffff80);
            }
          }
LAB_007f4104:
          view((QAccessibleTable *)0x7f410e);
          pQVar7 = QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_ffffffffffffff80)
          ;
          QVar5 = ::operator|((enum_type)((ulong)pQVar7 >> 0x20),(enum_type)pQVar7);
          (**(code **)(*(long *)pQVar7 + 0x68))
                    (pQVar7,&local_38,
                     QVar5.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
                     super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i);
          local_39 = true;
          goto LAB_007f4147;
        }
      }
      local_39 = false;
      goto LAB_007f4147;
    }
  }
  local_39 = false;
LAB_007f4147:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_39;
}

Assistant:

bool QAccessibleTable::selectRow(int row)
{
    QAbstractItemView *theView = view();
    const QAbstractItemModel *theModel = theView->model();
    if (!theModel || !view()->selectionModel())
        return false;

    const QModelIndex rootIndex = theView->rootIndex();
    const QModelIndex index = theModel->index(row, 0, rootIndex);

    if (!index.isValid() || view()->selectionBehavior() == QAbstractItemView::SelectColumns)
        return false;

    switch (view()->selectionMode()) {
    case QAbstractItemView::NoSelection:
        return false;
    case QAbstractItemView::SingleSelection:
        if (view()->selectionBehavior() != QAbstractItemView::SelectRows && columnCount() > 1 )
            return false;
        view()->clearSelection();
        break;
    case QAbstractItemView::ContiguousSelection:
        if ((!row || !theView->selectionModel()->isRowSelected(row - 1, rootIndex))
            && !theView->selectionModel()->isRowSelected(row + 1, rootIndex)) {
            theView->clearSelection();
        }
        break;
    default:
        break;
    }

    view()->selectionModel()->select(index, QItemSelectionModel::Select | QItemSelectionModel::Rows);
    return true;
}